

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fatcat.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint cluster;
  uint uVar4;
  undefined4 extraout_var;
  undefined7 uVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined4 extraout_var_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  undefined4 extraout_var_07;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_03;
  undefined4 extraout_var_08;
  long lVar6;
  long extraout_RAX_04;
  ostream *poVar7;
  unsigned_long_long uVar8;
  string *psVar9;
  uint uVar11;
  bool listDeleted_;
  EVP_PKEY_CTX *ctx;
  FatPath *this;
  char *pcVar13;
  FatSystem *pFVar14;
  long lVar15;
  bool isContiguous;
  FatPath path;
  string backupFile;
  string entryPath;
  string listPath;
  string extractDirectory;
  string readPath;
  string error;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  FatPath path_2;
  uint local_538;
  uint local_534;
  uint local_530;
  int local_52c;
  OutputFormatType local_528;
  uint local_524;
  string local_510;
  ulong local_4f0;
  ulong local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  ulong local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  ulong local_488;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  ulong local_468;
  undefined8 local_460;
  ulong local_458;
  ulong local_450;
  unsigned_long_long local_448;
  undefined1 local_440 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Rb_tree<int,_std::pair<const_int,_FatEntry>,_std::_Select1st<std::pair<const_int,_FatEntry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FatEntry>_>_>
  local_400;
  unsigned_long_long local_3c0;
  _Alloc_hider local_3b0;
  int local_3a8;
  undefined4 uStack_3a4;
  undefined1 *local_390;
  long local_388;
  undefined1 local_380 [16];
  char *local_370;
  long local_368;
  char local_360 [16];
  char *local_350;
  long local_348;
  char local_340 [16];
  char *local_330;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  undefined1 *local_2a8;
  long local_2a0;
  undefined1 local_298 [16];
  undefined1 *local_288;
  long local_280;
  undefined1 local_278 [16];
  string local_268;
  string local_248;
  string local_228;
  FatSystem local_208;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  FatPath local_68;
  char *pcVar12;
  
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_350 = local_340;
  local_348 = 0;
  local_340[0] = '\0';
  local_288 = local_278;
  local_280 = 0;
  local_278[0] = 0;
  local_2a8 = local_298;
  local_2a0 = 0;
  local_298[0] = 0;
  local_390 = local_380;
  local_388 = 0;
  local_380[0] = 0;
  local_370 = local_360;
  local_368 = 0;
  local_4c8 = 0;
  local_360[0] = '\0';
  local_530 = 0xffffffff;
  local_4c0 = 0;
  local_4e8 = 0;
  local_4b8 = 0;
  cluster = 0;
  local_460 = 0;
  local_4e0 = 0;
  local_4f0 = 0;
  local_4a8 = 0;
  local_498 = 0;
  bVar1 = false;
  local_4d8 = 0;
  local_490 = 0;
  local_488 = 0;
  local_458 = 0;
  local_538 = 0;
  bVar2 = false;
  local_480 = 0;
  local_4a0 = 0;
  local_4d0 = 0;
  local_470 = 0;
  local_478 = 0;
  local_52c = 0;
  local_450 = 0;
  local_4b0 = 0;
  local_528 = Default;
  local_468 = 0;
  local_448 = 0;
switchD_00108fa8_caseD_1:
  iVar3 = getopt(argc,argv,"il:L:r:R:s:dc:hx:2@:ob:p:w:v:mt:Sze:O:fk:a:F:");
  pcVar12 = _optarg;
  pcVar13 = (char *)(ulong)(iVar3 - 0x40);
  uVar10 = (undefined7)
           ((ulong)((long)&switchD_00108fa8::switchdataD_00116004 +
                   (long)(int)(&switchD_00108fa8::switchdataD_00116004)[(long)pcVar13]) >> 8);
  switch(pcVar13) {
  case (char *)0x0:
    cluster = atoi(_optarg);
    local_4a8 = CONCAT71((int7)(CONCAT44(extraout_var_00,cluster) >> 8),1);
  case (char *)0x1:
  case (char *)0x2:
  case (char *)0x3:
  case (char *)0x4:
  case (char *)0x5:
  case (char *)0x7:
  case (char *)0x8:
  case (char *)0x9:
  case (char *)0xa:
  case (char *)0xb:
  case (char *)0xd:
  case (char *)0xe:
  case (char *)0x10:
  case (char *)0x11:
  case (char *)0x14:
  case (char *)0x15:
  case (char *)0x16:
  case (char *)0x17:
  case (char *)0x18:
  case (char *)0x19:
  case (char *)0x1a:
  case (char *)0x1b:
  case (char *)0x1c:
  case (char *)0x1d:
  case (char *)0x1e:
  case (char *)0x1f:
  case (char *)0x20:
  case (char *)0x27:
  case (char *)0x2a:
  case (char *)0x2e:
  case (char *)0x31:
  case (char *)0x35:
  case (char *)0x39:
    goto switchD_00108fa8_caseD_1;
  case (char *)0x6:
    break;
  case (char *)0xc:
    local_524 = atoi(_optarg);
    local_4c0 = CONCAT71((int7)(CONCAT44(extraout_var_05,local_524) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0xf:
    local_448 = atoll(_optarg);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x12:
    cluster = atoi(_optarg);
    local_4b8 = CONCAT71((int7)(CONCAT44(extraout_var_04,cluster) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x13:
    bVar2 = true;
    goto switchD_00108fa8_caseD_1;
  case (char *)0x21:
    local_52c = atoi(_optarg);
    local_450 = CONCAT71((int7)(CONCAT44(extraout_var_06,local_52c) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x22:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,_optarg,(allocator<char> *)local_440);
    std::__cxx11::string::operator=((string *)&local_390,(string *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.filename._M_dataplus._M_p != &local_208.filename.field_2) {
      operator_delete(local_208.filename._M_dataplus._M_p,
                      local_208.filename.field_2._M_allocated_capacity + 1);
    }
    bVar1 = true;
    goto switchD_00108fa8_caseD_1;
  case (char *)0x23:
    cluster = atoi(_optarg);
    local_470 = CONCAT71((int7)(CONCAT44(extraout_var_03,cluster) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x24:
    local_460 = CONCAT71(uVar10,1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x25:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,_optarg,(allocator<char> *)local_440);
    std::__cxx11::string::operator=((string *)&local_370,(string *)&local_208);
    paVar5 = &local_208.filename.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.filename._M_dataplus._M_p != paVar5) {
      operator_delete(local_208.filename._M_dataplus._M_p,
                      local_208.filename.field_2._M_allocated_capacity + 1);
      paVar5 = extraout_RAX_01;
    }
    local_4d0 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x26:
    local_4a0 = CONCAT71(uVar10,1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x28:
    goto switchD_00108fa8_caseD_28;
  case (char *)0x29:
    local_468 = CONCAT71(uVar10,1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x2b:
    cluster = atoi(_optarg);
    local_4b0 = CONCAT71((int7)(CONCAT44(extraout_var_01,cluster) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x2c:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,_optarg,(allocator<char> *)local_440);
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_208);
    paVar5 = &local_208.filename.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.filename._M_dataplus._M_p != paVar5) {
      operator_delete(local_208.filename._M_dataplus._M_p,
                      local_208.filename.field_2._M_allocated_capacity + 1);
      paVar5 = extraout_RAX_02;
    }
    local_4c8 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x2d:
    local_488 = CONCAT71(uVar10,1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x2f:
    local_498 = CONCAT71(uVar10,1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x30:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,_optarg,(allocator<char> *)local_440);
    std::__cxx11::string::operator=((string *)&local_390,(string *)&local_208);
    paVar5 = &local_208.filename.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.filename._M_dataplus._M_p != paVar5) {
      operator_delete(local_208.filename._M_dataplus._M_p,
                      local_208.filename.field_2._M_allocated_capacity + 1);
      paVar5 = extraout_RAX_00;
    }
    local_4d8 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x32:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,_optarg,(allocator<char> *)local_440);
    std::__cxx11::string::operator=((string *)&local_288,(string *)&local_208);
    paVar5 = &local_208.filename.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.filename._M_dataplus._M_p != paVar5) {
      operator_delete(local_208.filename._M_dataplus._M_p,
                      local_208.filename.field_2._M_allocated_capacity + 1);
      paVar5 = extraout_RAX_03;
    }
    local_4e8 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x33:
    local_530 = atoi(_optarg);
    local_478 = CONCAT71((int7)(CONCAT44(extraout_var_07,local_530) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x34:
    local_538 = atoi(_optarg);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x36:
    local_534 = atoi(_optarg);
    local_458 = CONCAT71((int7)(CONCAT44(extraout_var_02,local_534) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x37:
    cluster = atoi(_optarg);
    local_490 = CONCAT71((int7)(CONCAT44(extraout_var_08,cluster) >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x38:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,_optarg,(allocator<char> *)local_440);
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)&local_208);
    paVar5 = &local_208.filename.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.filename._M_dataplus._M_p != paVar5) {
      operator_delete(local_208.filename._M_dataplus._M_p,
                      local_208.filename.field_2._M_allocated_capacity + 1);
      paVar5 = extraout_RAX;
    }
    local_4e0 = CONCAT71((int7)((ulong)paVar5 >> 8),1);
    goto switchD_00108fa8_caseD_1;
  case (char *)0x3a:
    local_480 = CONCAT71(uVar10,1);
    goto switchD_00108fa8_caseD_1;
  default:
    if (iVar3 == 0x32) {
      local_4f0 = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
    }
    else if (iVar3 == -1) {
      lVar6 = (long)_optind;
      if ((argc != _optind) &&
         (pcVar13 = argv[lVar6], pFVar14 = (FatSystem *)argv, pcVar13 != (char *)0x0))
      goto LAB_0010943a;
      goto switchD_00108fa8_caseD_28;
    }
    goto switchD_00108fa8_caseD_1;
  }
  iVar3 = strcmp(_optarg,"json");
  local_528 = Json;
  if (iVar3 == 0) goto switchD_00108fa8_caseD_1;
  iVar3 = strcmp(pcVar12,"default");
  local_528 = Default;
  if (iVar3 == 0) goto switchD_00108fa8_caseD_1;
switchD_00108fa8_caseD_28:
  do {
    usage();
    lVar6 = extraout_RAX_04;
    pFVar14 = (FatSystem *)argv;
LAB_0010943a:
    uVar11 = (int)lVar6 + 1;
    pcVar12 = (char *)(ulong)uVar11;
    argv = (char **)pFVar14;
    local_330 = pcVar13;
    if ((int)uVar11 < argc) {
      argc = argc - (int)lVar6;
      lVar15 = 1;
      argv = (char **)&local_208;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)argv,(&(pFVar14->filename)._M_dataplus)[lVar6 + lVar15]._M_p,
                   (allocator<char> *)local_440);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argv);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.filename._M_dataplus._M_p != &local_208.filename.field_2) {
          operator_delete(local_208.filename._M_dataplus._M_p,
                          local_208.filename.field_2._M_allocated_capacity + 1);
        }
        lVar15 = lVar15 + 1;
      } while (argc != (int)lVar15);
    }
    pcVar13 = pcVar12;
  } while ((((((((local_468 & 1) == 0) && ((local_4c8 & 1) == 0)) && ((local_4c0 & 1) == 0)) &&
             (((local_4e8 & 1) == 0 && ((local_4b8 & 1) == 0)))) &&
            ((((local_4e0 & 1) == 0 && (((local_4f0 & 1) == 0 && ((local_4a8 & 1) == 0)))) &&
             ((local_498 & 1) == 0)))) &&
           ((((!bVar1 && ((local_4d8 & 1) == 0)) && ((local_490 & 1) == 0)) &&
            ((((local_488 & 1) == 0 && (!bVar2)) &&
             (((local_480 & 1) == 0 && (((local_4d0 & 1) == 0 && ((local_4a0 & 1) == 0)))))))))) &&
          ((local_4b0 & 1) == 0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_228,local_330,(allocator<char> *)local_440);
  FatSystem::FatSystem(&local_208,&local_228,local_448,local_528);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  ctx = (EVP_PKEY_CTX *)(ulong)((byte)local_460 & 1);
  listDeleted_ = SUB41((byte)local_460 & 1,0);
  FatSystem::setListDeleted(&local_208,listDeleted_);
  iVar3 = FatSystem::init(&local_208,ctx);
  if ((char)iVar3 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"! Failed to init the FAT filesystem",0x23);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_0010a3f2:
    exit(1);
  }
  if ((local_468 & 1) != 0) {
    FatSystem::infos(&local_208);
    goto LAB_00109603;
  }
  if ((local_4c8 & 1) == 0) {
    if ((local_4c0 & 1) != 0) {
      if (local_528 == Default) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Listing cluster ",0x10);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      FatSystem::list(&local_208,local_524);
      goto LAB_00109603;
    }
    if ((local_4e8 & 1) != 0) {
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e8,local_288,local_288 + local_280);
      FatPath::FatPath((FatPath *)local_440,&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      FatSystem::readFile(&local_208,(FatPath *)local_440,(FILE *)0x0);
      goto LAB_001097d4;
    }
    if ((local_4b8 & 1) != 0) {
      FatSystem::readFile(&local_208,cluster,local_530,(FILE *)0x0,false);
      goto LAB_00109603;
    }
    if ((local_4e0 & 1) != 0) {
      FatExtract::FatExtract((FatExtract *)local_440,&local_208);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_2a8,local_2a8 + local_2a0);
      FatExtract::extract((FatExtract *)local_440,cluster,&local_308,listDeleted_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      local_440._0_8_ = &PTR_onDirectory_0011cc88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._24_8_ == &local_418) goto LAB_00109603;
LAB_001098bc:
      operator_delete((void *)local_440._24_8_,
                      (ulong)((long)&(((pointer)local_418._M_allocated_capacity)->_M_dataplus)._M_p
                             + 1));
      goto LAB_00109603;
    }
    if ((local_4f0 & 1) != 0) {
      FatDiff::FatDiff((FatDiff *)local_440,&local_208);
      FatDiff::compare((FatDiff *)local_440);
      goto LAB_00109603;
    }
    if ((local_4a8 & 1) == 0) {
      if ((local_498 & 1) == 0) {
        if ((local_4a0 & 1) != 0) {
          FatFix::FatFix((FatFix *)local_440,&local_208);
          FatFix::fix((FatFix *)local_440);
          goto LAB_00109603;
        }
        if ((local_4b0 & 1) != 0) {
          FatSearch::FatSearch((FatSearch *)local_440,&local_208);
          FatSearch::search((FatSearch *)local_440,cluster);
          goto LAB_00109603;
        }
        if ((bVar1) || ((local_4d8 & 1) != 0)) {
          FatBackup::FatBackup((FatBackup *)local_440,&local_208);
          if (bVar1) {
            paVar5 = &local_248.field_2;
            local_248._M_dataplus._M_p = (pointer)paVar5;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,local_390,local_390 + local_388);
            FatBackup::backup((FatBackup *)local_440,&local_248,local_538);
            local_440._24_8_ = local_248._M_dataplus._M_p;
          }
          else {
            paVar5 = &local_268.field_2;
            local_268._M_dataplus._M_p = (pointer)paVar5;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_268,local_390,local_390 + local_388);
            FatBackup::patch((FatBackup *)local_440,&local_268,local_538);
            local_440._24_8_ = local_268._M_dataplus._M_p;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_440._24_8_ == paVar5) goto LAB_00109603;
          local_418._M_allocated_capacity = paVar5->_M_allocated_capacity;
          goto LAB_001098bc;
        }
        if ((local_490 & 1) != 0) {
          if ((local_458 & 1) == 0) {
            psVar9 = (string *)__cxa_allocate_exception(0x20);
            *(string **)psVar9 = psVar9 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      (psVar9,"You should provide a value with -v","");
            __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          uVar11 = FatSystem::nextCluster(&local_208,cluster,0);
          printf("Writing next cluster of %u from %u to %u\n",(ulong)cluster,(ulong)uVar11);
          FatSystem::enableWrite(&local_208);
          if (local_538 < 2) {
            puts("Writing on FAT1");
            FatSystem::writeNextCluster(&local_208,cluster,local_534,0);
          }
          if ((local_538 & 0xfffffffd) == 0) {
            puts("Writing on FAT2");
            FatSystem::writeNextCluster(&local_208,cluster,local_534,1);
          }
          goto LAB_00109603;
        }
        if ((local_488 & 1) != 0) {
          FatDiff::FatDiff((FatDiff *)local_440,&local_208);
          FatDiff::merge((FatDiff *)local_440);
          goto LAB_00109603;
        }
        if ((bVar2 != false) || ((local_480 & 1) != 0)) {
          FatSystem::enableWrite(&local_208);
          FatSystem::rewriteUnallocated(&local_208,bVar2);
          goto LAB_00109603;
        }
        if ((local_4d0 & 1) == 0) goto LAB_00109603;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Searching entry for ",0x14);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_370,local_368);
        std::endl<char,std::char_traits<char>>(poVar7);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,local_370,local_370 + local_368);
        FatPath::FatPath(&local_68,&local_328);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        FatEntry::FatEntry((FatEntry *)local_440);
        bVar2 = FatSystem::findFile(&local_208,&local_68,(FatEntry *)local_440);
        if (!bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Entry not found.",0x10);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          goto LAB_0010a3f2;
        }
        printf("Entry address %016llx\n",local_3c0);
        printf("Attributes %02X\n",(ulong)(uint)(int)(char)local_400._M_impl._0_1_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Found entry, cluster=",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        bVar2 = FatEntry::isDirectory((FatEntry *)local_440);
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,", directory",0xb);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,", file with size=",0x11);
          poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," (",2);
          prettySize_abi_cxx11_(&local_510,local_400._M_impl.super__Rb_tree_header._M_header._0_8_);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_510._M_dataplus._M_p,local_510._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        if ((local_470 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Setting the cluster to ",0x17);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar7);
          local_400._M_impl._4_4_ = cluster;
        }
        if ((local_478 & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Setting the size to ",0x14);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar7);
          local_400._M_impl.super__Rb_tree_header._M_header._0_8_ = (ulong)local_530;
        }
        if ((local_450 & 1) == 0) {
          if ((((byte)local_470 | (byte)local_478) & 1) != 0) goto LAB_0010a06d;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Setting attributes to ",0x16);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_52c);
          std::endl<char,std::char_traits<char>>(poVar7);
          local_400._M_impl._0_1_ = SUB41(local_52c,0);
LAB_0010a06d:
          FatEntry::updateData((FatEntry *)local_440);
          FatSystem::enableWrite(&local_208);
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_510,local_3b0._M_p,
                     local_3b0._M_p + CONCAT44(uStack_3a4,local_3a8));
          FatSystem::writeData(&local_208,local_3c0,local_510._M_dataplus._M_p,local_3a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
        }
        FatEntry::~FatEntry((FatEntry *)local_440);
        this = &local_68;
        goto LAB_001097dc;
      }
      FatChains::FatChains((FatChains *)local_440,&local_208);
      FatChains::chainsAnalysis((FatChains *)local_440);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cluster ",8);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," address:",9);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar8 = FatSystem::clusterAddress(&local_208,cluster,false);
      printf("%llu (%016llx)\n",uVar8,uVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Next cluster:",0xd);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      uVar11 = FatSystem::nextCluster(&local_208,cluster,0);
      uVar4 = FatSystem::nextCluster(&local_208,cluster,1);
      printf("FAT1: %u (%08x)\n",(ulong)uVar11,(ulong)uVar11);
      printf("FAT2: %u (%08x)\n",(ulong)uVar4,(ulong)uVar4);
      local_510._M_dataplus._M_p = local_510._M_dataplus._M_p & 0xffffffffffffff00;
      FatChains::FatChains((FatChains *)local_440,&local_208);
      iVar3 = FatChains::chainSize((FatChains *)local_440,cluster,(bool *)&local_510);
      uVar8 = local_208.bytesPerCluster * (long)iVar3;
      prettySize_abi_cxx11_(&local_68.path,uVar8);
      printf("Chain size: %llu (%llu / %s)\n",(long)iVar3,uVar8,local_68.path._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.path._M_dataplus._M_p != &local_68.path.field_2) {
        operator_delete(local_68.path._M_dataplus._M_p,
                        local_68.path.field_2._M_allocated_capacity + 1);
      }
      pcVar13 = "Chain is not contiguous";
      if ((char)local_510._M_dataplus._M_p != '\0') {
        pcVar13 = "Chain is contiguous";
      }
      puts(pcVar13);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_FatEntry>,_std::_Select1st<std::pair<const_int,_FatEntry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FatEntry>_>_>
    ::~_Rb_tree(&local_400);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FatEntry,_std::allocator<FatEntry>_>_>_>_>
                 *)(local_440 + 0x10));
  }
  else {
    if (local_528 == Default) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Listing path ",0xd);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_350,local_348);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,local_350,local_350 + local_348);
    FatPath::FatPath((FatPath *)local_440,&local_2c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    FatSystem::list(&local_208,(FatPath *)local_440);
LAB_001097d4:
    this = (FatPath *)local_440;
LAB_001097dc:
    FatPath::~FatPath(this);
  }
LAB_00109603:
  FatSystem::~FatSystem(&local_208);
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    vector<string> arguments;
    char *image = NULL;
    int index;

    // -O offset
    unsigned long long globalOffset = 0;

    // -s, specify the size to be read
    unsigned int size = -1;

    // -i, display information about the disk
    bool infoFlag = false;

    // -l, list directories in the given path
    bool listFlag = false;
    string listPath;

    // -c, listing for a direct cluster
    bool listClusterFlag = false;
    unsigned int listCluster;

    // -r, reads a file
    bool readFlag = false;
    string readPath;

    // -R, reads from cluster file
    bool clusterRead = false;
    unsigned int cluster = 0;

    // -d, lists deleted
    bool listDeleted = false;

    // -x: extract
    bool extract = false;
    string extractDirectory;

    // -2: compare two fats
    bool compare = false;

    // -@: get the cluster address
    bool address = false;

    // -k: analysis the chains
    bool chains = false;

    // -b: backup the fats
    bool backup = false;
    bool patch = false;
    string backupFile;

    // -w: write next cluster
    bool writeNext = false;

    // -m: merge the FATs
    bool merge = false;

    // -v: value
    bool hasValue = false;
    unsigned int value;

    // -t: FAT table to write or read
    unsigned int table = 0;

    // -S: write random data in unallocated sectors
    bool scramble = false;
    bool zero = false;

    // -f: fix reachable
    bool fixReachable = false;

    // -e: entry hacking
    bool entry = false;
    string entryPath;
    bool clusterProvided = false;
    bool sizeProvided = false;
    int attributes = 0;
    bool attributesProvided = false;

    // -k: entry finder
    bool findEntry = false;
    OutputFormatType outputFormat = Default;

    // Parsing command line
    while ((index = getopt(argc, argv, "il:L:r:R:s:dc:hx:2@:ob:p:w:v:mt:Sze:O:fk:a:F:")) != -1) {
        switch (index) {
        case 'a':
            attributesProvided = true;
            attributes = atoi(optarg);
            break;
        case 'k':
            findEntry = true;
            cluster = atoi(optarg);
            break;
        case 'f':
            fixReachable = true;
            break;
        case 'O':
            globalOffset = atoll(optarg);
            break;
        case 'e':
            entry = true;
            entryPath = string(optarg);
            break;
        case 'z':
            zero = true;
            break;
        case 'S':
            scramble = true;
            break;
        case 't':
            table = ATOU(optarg);
            break;
        case 'm':
            merge = true;
            break;
        case 'v':
            hasValue = true;
            value = ATOU(optarg);
            break;
        case 'w':
            writeNext = true;
            cluster = ATOU(optarg);
            break;
        case '@':
            address = true;
            cluster = ATOU(optarg);
            break;
        case 'o':
            chains = true;
            break;
        case 'i':
            infoFlag = true;
            break;
        case 'l':
            listFlag = true;
            listPath = string(optarg);
            break;
        case 'L':
            listClusterFlag = true;
            listCluster = ATOU(optarg);
            break;
        case 'r':
            readFlag = true;
            readPath = string(optarg);
            break;
        case 'R':
            clusterRead = true;
            cluster = ATOU(optarg);
            break;
        case 's':
            size = ATOU(optarg);
            sizeProvided = true;
            break;
        case 'd':
            listDeleted = true;
            break;
        case 'c':
            cluster = ATOU(optarg);
            clusterProvided = true;
            break;
        case 'x':
            extract = true;
            extractDirectory = string(optarg);
            break;
        case '2':
            compare = true;
            break;
        case 'b':
            backup = true;
            backupFile = string(optarg);
            break;
        case 'p':
            patch = true;
            backupFile = string(optarg);
            break;
        case 'h':
            usage();
            break;
        case 'F':
            if (strcmp(optarg, "json") == 0)
                outputFormat = Json;
            else if (strcmp(optarg, "default") == 0)
                outputFormat = Default;
            else
            {
                usage();
            }
            break;
        }
    }

    // Trying to get the FAT file or device
    if (optind != argc) {
        image = argv[optind];
    }

    if (!image) {
        usage();
    }

    // Getting extra arguments
    for (index=optind+1; index<argc; index++) {
        arguments.push_back(argv[index]);
    }

    // If the user did not required any actions
    if (!(infoFlag || listFlag || listClusterFlag || 
        readFlag || clusterRead || extract || compare || address ||
        chains || backup || patch || writeNext || merge ||
        scramble || zero || entry || fixReachable || findEntry)) {
        usage();
    }

    try {
        // Openning the image
        FatSystem fat(image, globalOffset, outputFormat);

        fat.setListDeleted(listDeleted);

        if (fat.init()) {
            if (infoFlag) {
                fat.infos();
            } else if (listFlag) {
                if (outputFormat != Json)
                    cout << "Listing path " << listPath << endl;
                FatPath path(listPath);
                fat.list(path);
            } else if (listClusterFlag) {
                if (outputFormat != Json)
                    cout << "Listing cluster " << listCluster << endl;
                fat.list(listCluster);
            } else if (readFlag) {
                FatPath path(readPath);
                fat.readFile(path);
            } else if (clusterRead) {
                fat.readFile(cluster, size);
            } else if (extract) {
                FatExtract extract(fat);
                extract.extract(cluster, extractDirectory, listDeleted);
            } else if (compare) {
                FatDiff diff(fat);
                diff.compare();
            } else if (address) {
                cout << "Cluster " << cluster << " address:" << endl;
                long long addr = fat.clusterAddress(cluster);
                printf("%llu (%016llx)\n", addr, addr);
                cout << "Next cluster:" << endl;
                int next1 = fat.nextCluster(cluster, 0);
                int next2 = fat.nextCluster(cluster, 1);
                printf("FAT1: %u (%08x)\n", next1, next1);
                printf("FAT2: %u (%08x)\n", next2, next2);
                bool isContiguous = false;

                FatChains chains(fat);
                unsigned long long size = chains.chainSize(cluster, &isContiguous);
                printf("Chain size: %llu (%llu / %s)\n", size, size*fat.bytesPerCluster, prettySize(size*fat.bytesPerCluster).c_str());
                if (isContiguous) {
                    printf("Chain is contiguous\n");
                } else {
                    printf("Chain is not contiguous\n");
                }
            } else if (chains) {
                FatChains chains(fat);
                chains.chainsAnalysis();
            } else if (fixReachable) {
                FatFix fix(fat);
                fix.fix();
            } else if (findEntry) {
                FatSearch search(fat);
                search.search(cluster);
            } else if (backup || patch) {
                FatBackup backupSystem(fat);
                
                if (backup) {
                    backupSystem.backup(backupFile, table);
                } else {
                    backupSystem.patch(backupFile, table);
                }
            } else if (writeNext) {
                if (!hasValue) {
                    throw string("You should provide a value with -v");
                }

                int prev = fat.nextCluster(cluster);
                printf("Writing next cluster of %u from %u to %u\n", cluster, prev, value);
                fat.enableWrite();

                if (table == 0 || table == 1) {
                    printf("Writing on FAT1\n");
                    fat.writeNextCluster(cluster, value, 0);
                } 
                if (table == 0 || table == 2) {
                    printf("Writing on FAT2\n");
                    fat.writeNextCluster(cluster, value, 1);
                } 
            } else if (merge) {
                FatDiff diff(fat);
                diff.merge();
            } else if (scramble) {
                fat.enableWrite();
                fat.rewriteUnallocated(1);
            } else if (zero) {
                fat.enableWrite();
                fat.rewriteUnallocated();
            } else if (entry) {
                cout << "Searching entry for " << entryPath << endl;
                FatPath path(entryPath);
                FatEntry entry;
                if (fat.findFile(path, entry)) {
                    printf("Entry address %016llx\n", entry.address);
                    printf("Attributes %02X\n", entry.attributes);
                    cout << "Found entry, cluster=" << entry.cluster;
                    if (entry.isDirectory()) {
                        cout << ", directory";
                    } else {
                        cout << ", file with size=" << entry.size << " (" << prettySize(entry.size) << ")";
                    }
                    cout << endl;

                    if (clusterProvided) {
                        cout << "Setting the cluster to " << cluster << endl;
                        entry.cluster = cluster;
                    }
                    if (sizeProvided) {
                        cout << "Setting the size to " << size << endl;
                        entry.size = size&0xffffffff;
                    }
                    if (attributesProvided) {
                        cout << "Setting attributes to " << attributes << endl;
                        entry.attributes = attributes;
                    }
                    if (clusterProvided || sizeProvided || attributesProvided) {
                        entry.updateData();
                        fat.enableWrite();
                        string data = entry.data;
                        fat.writeData(entry.address, data.c_str(), entry.data.size());
                    }
                } else {
                    cerr << "Entry not found." << endl;
                    exit(EXIT_FAILURE);
                }
            }
        } else {
            cerr << "! Failed to init the FAT filesystem" << endl;
            exit(EXIT_FAILURE);
        }
    } catch (string error) {
        cerr << "Error: " << error << endl;
        exit(EXIT_FAILURE);
    }

    exit(EXIT_SUCCESS);
}